

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

SmallBuffer * helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,int64_t val)

{
  value_t vVar1;
  json_value jVar2;
  char *pcVar3;
  undefined8 uVar4;
  string *val_00;
  reference pvVar5;
  ulong uVar6;
  string *this;
  double valval;
  string_view valname;
  string_view valname_00;
  complex<double> cvec;
  int64_t val_local;
  json json;
  data local_38;
  data local_28;
  
  this = (string *)&cvec;
  val_local = val;
  switch(type) {
  case HELICS_STRING:
  case HELICS_CHAR:
    helicsIntString_abi_cxx11_((string *)&cvec,(helics *)val,val);
    json.m_data._0_8_ = cvec._M_value._8_8_;
    json.m_data.m_value = (json_value)cvec._M_value._0_8_;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&json);
    this = (string *)&cvec;
    goto LAB_001f1163;
  case HELICS_DOUBLE:
    cvec._M_value._0_8_ = (BADTYPE)val;
    ValueConverter<double>::convert(__return_storage_ptr__,(double *)&cvec);
    break;
  case HELICS_COMPLEX:
    cvec._M_value._0_8_ = (BADTYPE)val;
    cvec._M_value._8_8_ = 0;
    ValueConverter<std::complex<double>_>::convert(__return_storage_ptr__,&cvec);
    break;
  case HELICS_VECTOR:
    cvec._M_value._0_8_ = (BADTYPE)val;
    ValueConverter<double>::convert(__return_storage_ptr__,(double *)&cvec,1);
    break;
  case HELICS_COMPLEX_VECTOR:
    cvec._M_value._0_8_ = (BADTYPE)val;
    cvec._M_value._8_8_ = 0;
    ValueConverter<std::complex<double>_>::convert(__return_storage_ptr__,&cvec,1);
    break;
  case HELICS_NAMED_POINT:
    uVar6 = -val;
    if (0 < val) {
      uVar6 = val;
    }
    if (uVar6 < 0x10000000000001) {
      valname_00._M_str = "value";
      valname_00._M_len = 5;
      NamedPoint::NamedPoint((NamedPoint *)&cvec,valname_00,(double)val);
      ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,(NamedPoint *)&cvec);
    }
    else {
      helicsIntString_abi_cxx11_((string *)&json,(helics *)val,val);
      jVar2 = json.m_data.m_value;
      uVar4 = json.m_data._0_8_;
      valval = nan("0");
      valname._M_str = (char *)uVar4;
      valname._M_len = (size_t)jVar2.object;
      NamedPoint::NamedPoint((NamedPoint *)&cvec,valname,valval);
      ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,(NamedPoint *)&cvec);
      std::__cxx11::string::~string((string *)&cvec);
      this = (string *)&json;
    }
LAB_001f1163:
    std::__cxx11::string::~string(this);
    break;
  case HELICS_BOOL:
    pcVar3 = "*1";
    if (val == 0) {
      pcVar3 = "+0";
    }
    cvec._M_value._8_8_ = pcVar3 + 1;
    cvec._M_value._0_8_ = 1;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&cvec);
    break;
  default:
    if (type == HELICS_JSON) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&json,(nullptr_t)0x0);
      val_00 = typeNameStringRef_abi_cxx11_(HELICS_INT);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_00);
      pvVar5 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"type");
      vVar1 = (pvVar5->m_data).m_type;
      (pvVar5->m_data).m_type = local_28.m_type;
      jVar2 = (pvVar5->m_data).m_value;
      (pvVar5->m_data).m_value = local_28.m_value;
      local_28.m_type = vVar1;
      local_28.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_28);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<long_&,_long,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_38,&val_local);
      pvVar5 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"value");
      vVar1 = (pvVar5->m_data).m_type;
      (pvVar5->m_data).m_type = local_38.m_type;
      jVar2 = (pvVar5->m_data).m_value;
      (pvVar5->m_data).m_value = local_38.m_value;
      local_38.m_type = vVar1;
      local_38.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_38);
      fileops::generateJsonString((string *)&cvec,&json,true);
      SmallBuffer::SmallBuffer<std::__cxx11::string,void>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cvec);
      std::__cxx11::string::~string((string *)&cvec);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&json.m_data);
      return __return_storage_ptr__;
    }
  case HELICS_INT:
  case HELICS_TIME:
    ValueConverter<long>::convert(__return_storage_ptr__,&val_local);
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, int64_t val)
{
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(static_cast<double>(val));
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME:
        default:
            return ValueConverter<int64_t>::convert(val);
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(
                std::complex<double>(static_cast<double>(val), 0.0));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((val != 0) ? "1" : "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(helicsIntString(val));
        case DataType::HELICS_NAMED_POINT:
            if (static_cast<uint64_t>(std::abs(val)) >
                (2ULL << 51U))  // this checks whether the actual value will fit in a double
            {
                return ValueConverter<NamedPoint>::convert(
                    NamedPoint{helicsIntString(val), std::nan("0")});
            } else {
                return ValueConverter<NamedPoint>::convert(
                    NamedPoint{"value", static_cast<double>(val)});
            }

        case DataType::HELICS_COMPLEX_VECTOR: {
            const std::complex<double> cvec(static_cast<double>(val), 0.0);
            return ValueConverter<std::complex<double>>::convert(&cvec, 1);
        }
        case DataType::HELICS_VECTOR: {
            const auto doubleVal = static_cast<double>(val);
            return ValueConverter<double>::convert(&doubleVal, 1);
        }
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_INT);
            json["value"] = val;
            return fileops::generateJsonString(json);
        }
    }
}